

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::DescriptorBuilder::CheckFieldJsonNameUniqueness
          (DescriptorBuilder *this,string_view message_name,DescriptorProto *message,
          Descriptor *descriptor,bool use_custom_names)

{
  char cVar1;
  ushort uVar2;
  undefined1 auVar3 [16];
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_00;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_01;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_02;
  string_view element_name;
  string_view element_name_00;
  string_view element_name_01;
  byte bVar4;
  bool bVar5;
  uint32_t uVar6;
  uint uVar7;
  void **ppvVar8;
  size_t *psVar9;
  CommonFields *common;
  reference ppVar10;
  byte bVar11;
  anon_union_8_1_a8a14541_for_iterator_2 aVar12;
  char *pcVar13;
  anon_union_8_1_a8a14541_for_iterator_2 this_00;
  undefined8 uVar14;
  string sVar15;
  RepeatedPtrField<google::protobuf::FieldDescriptorProto> *this_01;
  ctrl_t *pcVar16;
  undefined7 in_register_00000089;
  PolicyFunctions *policy;
  size_t sVar17;
  ctrl_t *ctrl;
  ulong uVar18;
  ushort uVar19;
  undefined4 uVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  __m128i match;
  undefined1 auVar24 [16];
  ctrl_t cVar25;
  ctrl_t cVar28;
  ctrl_t cVar29;
  ctrl_t cVar30;
  ctrl_t cVar31;
  ctrl_t cVar32;
  ctrl_t cVar33;
  ctrl_t cVar34;
  ctrl_t cVar35;
  ctrl_t cVar36;
  ctrl_t cVar37;
  ctrl_t cVar38;
  ctrl_t cVar39;
  ctrl_t cVar40;
  ctrl_t cVar41;
  ctrl_t cVar42;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  iterator iVar43;
  FindInfo target;
  string_view v;
  string_view v_00;
  string_view input;
  anon_class_24_3_4f82d86e make_error;
  flat_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>_>_>
  name_to_field;
  JsonNameDetails details;
  pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>_>_>::iterator,_bool>
  it_inserted;
  anon_union_8_1_a8a14541_for_iterator_2 local_1b0;
  anon_union_8_1_a8a14541_for_iterator_2 *local_1a8;
  anon_union_8_1_a8a14541_for_iterator_2 local_1a0;
  undefined8 uStack_198;
  undefined4 local_18c;
  CommonFields local_188;
  anon_union_8_1_a8a14541_for_iterator_2 local_168;
  anon_union_8_1_a8a14541_for_iterator_2 local_160;
  anon_union_8_1_a8a14541_for_iterator_2 *local_158;
  anon_union_8_1_a8a14541_for_iterator_2 local_150;
  undefined8 uStack_148;
  string local_140;
  DescriptorBuilder *local_138;
  size_t local_130;
  char *local_128;
  anon_union_8_1_a8a14541_for_iterator_2 local_120;
  anon_union_8_1_a8a14541_for_iterator_2 local_118;
  anon_union_8_1_a8a14541_for_iterator_2 local_110;
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  Descriptor *local_e0;
  ctrl_t *local_d8;
  void **local_d0;
  void **local_c8;
  iterator local_c0;
  byte local_b0;
  VoidPtr local_a8;
  code *pcStack_a0;
  VoidPtr local_98;
  code *pcStack_90;
  VoidPtr local_88;
  code *pcStack_80;
  iterator local_78;
  char *local_68;
  long local_60;
  ctrl_t local_48;
  ctrl_t cStack_47;
  ctrl_t cStack_46;
  ctrl_t cStack_45;
  ctrl_t cStack_44;
  ctrl_t cStack_43;
  ctrl_t cStack_42;
  ctrl_t cStack_41;
  ctrl_t cStack_40;
  ctrl_t cStack_3f;
  ctrl_t cStack_3e;
  ctrl_t cStack_3d;
  ctrl_t cStack_3c;
  ctrl_t cStack_3b;
  ctrl_t cStack_3a;
  ctrl_t cStack_39;
  
  policy = (PolicyFunctions *)CONCAT71(in_register_00000089,use_custom_names);
  local_128 = message_name._M_str;
  local_130 = message_name._M_len;
  local_18c = SUB84(policy,0);
  local_188.capacity_ = 0;
  local_188.size_ = 0;
  local_188.heap_or_soo_.heap.control = absl::lts_20250127::container_internal::kEmptyGroup + 0x10;
  this_01 = &(message->field_0)._impl_.field_;
  local_138 = this;
  local_e0 = descriptor;
  ppvVar8 = internal::RepeatedPtrFieldBase::elements(&this_01->super_RepeatedPtrFieldBase);
  local_d0 = (void **)RepeatedPtrField<google::protobuf::FieldDescriptorProto>::end(this_01);
  bVar4 = (byte)local_18c;
  do {
    if (ppvVar8 == local_d0) {
      absl::lts_20250127::container_internal::
      raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>_>_>
      ::~raw_hash_set((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>_>_>
                       *)&local_188);
      return;
    }
    aVar12.slot_ = (slot_type *)*ppvVar8;
    psVar9 = (size_t *)
             ((ulong)((anon_union_8_1_a8a14541_for_iterator_2 *)((long)aVar12.slot_ + 0x18))->slot_
             & 0xfffffffffffffffc);
    input._M_str = (char *)message;
    input._M_len = *psVar9;
    protobuf::(anonymous_namespace)::ToJsonName_abi_cxx11_
              ((string *)&local_1b0,(_anonymous_namespace_ *)psVar9[1],input);
    if ((((byte)local_18c == '\0') ||
        ((undefined1  [80])((undefined1  [80])*(slot_type *)aVar12 & (undefined1  [80])0x10) ==
         (undefined1  [80])0x0)) ||
       (bVar5 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((ulong)((anon_union_8_1_a8a14541_for_iterator_2 *)
                                         ((long)aVar12.slot_ + 0x38))->slot_ & 0xfffffffffffffffc),
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&local_1b0), !bVar5)) {
      local_158 = local_1a8;
      if (local_1b0.slot_ == (slot_type *)&local_1a0) {
        uStack_148 = uStack_198;
        local_160.slot_ = (slot_type *)&local_150;
      }
      else {
        local_160.slot_ = (slot_type *)local_1b0;
      }
      local_150.slot_ = (slot_type *)local_1a0;
      local_1a8 = (anon_union_8_1_a8a14541_for_iterator_2 *)0x0;
      local_1a0.slot_ = (slot_type *)((ulong)local_1a0.slot_ & 0xffffffffffffff00);
      sVar15 = (string)0x0;
      local_1b0.slot_ = (slot_type *)&local_1a0;
      local_168.slot_ = aVar12.slot_;
    }
    else {
      sVar15 = (string)0x1;
      local_168.slot_ = aVar12.slot_;
      std::__cxx11::string::string
                ((string *)&local_160,
                 (string *)
                 ((ulong)((anon_union_8_1_a8a14541_for_iterator_2 *)((long)aVar12.slot_ + 0x38))->
                         slot_ & 0xfffffffffffffffc));
    }
    local_140 = sVar15;
    std::__cxx11::string::~string((string *)&local_1b0);
    if (local_140 == (string)0x1) {
      std::__cxx11::string::string((string *)&local_68,(string *)&local_160);
      if ((local_60 == 0) || (*local_68 != '[')) {
        std::__cxx11::string::~string((string *)&local_68);
        goto LAB_00191995;
      }
      cVar1 = local_68[local_60 + -1];
      std::__cxx11::string::~string((string *)&local_68);
      if (cVar1 != ']') goto LAB_00191995;
      local_1a8 = &local_168;
      pcStack_80 = absl::lts_20250127::functional_internal::
                   InvokeObject<google::protobuf::DescriptorBuilder::CheckFieldJsonNameUniqueness(std::basic_string_view<char,std::char_traits<char>>,google::protobuf::DescriptorProto_const&,google::protobuf::Descriptor_const*,bool)::__0,std::__cxx11::string>
      ;
      local_88.obj = &local_1b0;
      element_name._M_str = local_128;
      element_name._M_len = local_130;
      make_error_00.invoker_ =
           absl::lts_20250127::functional_internal::
           InvokeObject<google::protobuf::DescriptorBuilder::CheckFieldJsonNameUniqueness(std::basic_string_view<char,std::char_traits<char>>,google::protobuf::DescriptorProto_const&,google::protobuf::Descriptor_const*,bool)::__0,std::__cxx11::string>
      ;
      make_error_00.ptr_.obj = local_88.obj;
      local_1b0.slot_ = aVar12.slot_;
      AddError(local_138,element_name,(Message *)aVar12.slot_,NAME,make_error_00);
      message = (DescriptorProto *)aVar12;
    }
    else {
LAB_00191995:
      local_120.slot_ = aVar12.slot_;
      local_c8 = ppvVar8;
      absl::lts_20250127::container_internal::
      raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>_>_>
      ::AssertNotDebugCapacity
                ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>_>_>
                  *)&local_188);
      v._M_str = (char *)local_160.slot_;
      v._M_len = (size_t)local_158;
      common = (CommonFields *)
               absl::lts_20250127::container_internal::StringHash::operator()
                         ((StringHash *)&local_188,v);
      absl::lts_20250127::container_internal::probe
                ((probe_seq<16UL> *)&local_1b0,&local_188,(size_t)common);
      uVar14 = local_188.heap_or_soo_.heap.control;
      auVar21 = ZEXT216(CONCAT11((char)common,(char)common) & 0x7f7f);
      auVar21 = pshuflw(auVar21,auVar21,0);
      uVar20 = auVar21._0_4_;
      auVar21._4_4_ = uVar20;
      auVar21._0_4_ = uVar20;
      auVar21._8_4_ = uVar20;
      auVar21._12_4_ = uVar20;
      while( true ) {
        aVar12 = local_120;
        pcVar16 = (ctrl_t *)(uVar14 + (long)local_1a8);
        auVar22[0] = -(auVar21[0] == *pcVar16);
        auVar22[1] = -(auVar21[1] == pcVar16[1]);
        auVar22[2] = -(auVar21[2] == pcVar16[2]);
        auVar22[3] = -(auVar21[3] == pcVar16[3]);
        auVar22[4] = -(auVar21[4] == pcVar16[4]);
        auVar22[5] = -(auVar21[5] == pcVar16[5]);
        auVar22[6] = -(auVar21[6] == pcVar16[6]);
        auVar22[7] = -(auVar21[7] == pcVar16[7]);
        auVar22[8] = -(auVar21[8] == pcVar16[8]);
        auVar22[9] = -(auVar21[9] == pcVar16[9]);
        auVar22[10] = -(auVar21[10] == pcVar16[10]);
        auVar22[0xb] = -(auVar21[0xb] == pcVar16[0xb]);
        auVar22[0xc] = -(auVar21[0xc] == pcVar16[0xc]);
        auVar22[0xd] = -(auVar21[0xd] == pcVar16[0xd]);
        auVar22[0xe] = -(auVar21[0xe] == pcVar16[0xe]);
        auVar22[0xf] = -(auVar21[0xf] == pcVar16[0xf]);
        cVar25 = *pcVar16;
        cVar28 = pcVar16[1];
        cVar29 = pcVar16[2];
        cVar30 = pcVar16[3];
        cVar31 = pcVar16[4];
        cVar32 = pcVar16[5];
        cVar33 = pcVar16[6];
        cVar34 = pcVar16[7];
        cVar35 = pcVar16[8];
        cVar36 = pcVar16[9];
        cVar37 = pcVar16[10];
        cVar38 = pcVar16[0xb];
        cVar39 = pcVar16[0xc];
        cVar40 = pcVar16[0xd];
        cVar41 = pcVar16[0xe];
        cVar42 = pcVar16[0xf];
        for (uVar19 = (ushort)(SUB161(auVar22 >> 7,0) & 1) |
                      (ushort)(SUB161(auVar22 >> 0xf,0) & 1) << 1 |
                      (ushort)(SUB161(auVar22 >> 0x17,0) & 1) << 2 |
                      (ushort)(SUB161(auVar22 >> 0x1f,0) & 1) << 3 |
                      (ushort)(SUB161(auVar22 >> 0x27,0) & 1) << 4 |
                      (ushort)(SUB161(auVar22 >> 0x2f,0) & 1) << 5 |
                      (ushort)(SUB161(auVar22 >> 0x37,0) & 1) << 6 |
                      (ushort)(SUB161(auVar22 >> 0x3f,0) & 1) << 7 |
                      (ushort)(SUB161(auVar22 >> 0x47,0) & 1) << 8 |
                      (ushort)(SUB161(auVar22 >> 0x4f,0) & 1) << 9 |
                      (ushort)(SUB161(auVar22 >> 0x57,0) & 1) << 10 |
                      (ushort)(SUB161(auVar22 >> 0x5f,0) & 1) << 0xb |
                      (ushort)(SUB161(auVar22 >> 0x67,0) & 1) << 0xc |
                      (ushort)(SUB161(auVar22 >> 0x6f,0) & 1) << 0xd |
                      (ushort)(SUB161(auVar22 >> 0x77,0) & 1) << 0xe |
                      (ushort)(auVar22[0xf] >> 7) << 0xf; uVar19 != 0; uVar19 = uVar19 - 1 & uVar19)
        {
          local_108[1] = cVar28;
          local_108[0] = cVar25;
          local_108[2] = cVar29;
          local_108[3] = cVar30;
          local_108[4] = cVar31;
          local_108[5] = cVar32;
          local_108[6] = cVar33;
          local_108[7] = cVar34;
          local_108[8] = cVar35;
          local_108[9] = cVar36;
          local_108[10] = cVar37;
          local_108[0xb] = cVar38;
          local_108[0xc] = cVar39;
          local_108[0xd] = cVar40;
          local_108[0xe] = cVar41;
          local_108[0xf] = cVar42;
          local_f8 = auVar21;
          uVar6 = absl::lts_20250127::container_internal::TrailingZeros<unsigned_short>(uVar19);
          local_118.slot_ = (slot_type *)&local_160;
          message = (DescriptorProto *)&local_188;
          local_110.slot_ = (slot_type *)message;
          bVar5 = absl::lts_20250127::container_internal::
                  hash_policy_traits<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::(anonymous_namespace)::JsonNameDetails>,void>
                  ::
                  apply<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::(anonymous_namespace)::JsonNameDetails>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::(anonymous_namespace)::JsonNameDetails>>>::EqualElement<std::__cxx11::string>,std::pair<std::__cxx11::string_const,google::protobuf::(anonymous_namespace)::JsonNameDetails>&,absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::(anonymous_namespace)::JsonNameDetails>>
                            ((EqualElement<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&local_118,
                             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>
                              *)(((long)local_1a8 + (ulong)uVar6 & (ulong)local_1b0.slot_) * 0x50 +
                                (long)local_188.heap_or_soo_.heap.slot_array));
          if (bVar5) {
            sVar17 = (long)local_1a8 + (ulong)uVar6 & (ulong)local_1b0.slot_;
            bVar11 = 0;
            goto LAB_00191aed;
          }
          auVar21 = local_f8;
          cVar25 = local_108[0];
          cVar28 = local_108[1];
          cVar29 = local_108[2];
          cVar30 = local_108[3];
          cVar31 = local_108[4];
          cVar32 = local_108[5];
          cVar33 = local_108[6];
          cVar34 = local_108[7];
          cVar35 = local_108[8];
          cVar36 = local_108[9];
          cVar37 = local_108[10];
          cVar38 = local_108[0xb];
          cVar39 = local_108[0xc];
          cVar40 = local_108[0xd];
          cVar41 = local_108[0xe];
          cVar42 = local_108[0xf];
        }
        auVar26[0] = -(cVar25 == kEmpty);
        auVar26[1] = -(cVar28 == kEmpty);
        auVar26[2] = -(cVar29 == kEmpty);
        auVar26[3] = -(cVar30 == kEmpty);
        auVar26[4] = -(cVar31 == kEmpty);
        auVar26[5] = -(cVar32 == kEmpty);
        auVar26[6] = -(cVar33 == kEmpty);
        auVar26[7] = -(cVar34 == kEmpty);
        auVar26[8] = -(cVar35 == kEmpty);
        auVar26[9] = -(cVar36 == kEmpty);
        auVar26[10] = -(cVar37 == kEmpty);
        auVar26[0xb] = -(cVar38 == kEmpty);
        auVar26[0xc] = -(cVar39 == kEmpty);
        auVar26[0xd] = -(cVar40 == kEmpty);
        auVar26[0xe] = -(cVar41 == kEmpty);
        auVar26[0xf] = -(cVar42 == kEmpty);
        uVar19 = (ushort)(SUB161(auVar26 >> 7,0) & 1) | (ushort)(SUB161(auVar26 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar26 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar26 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar26 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar26 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar26 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar26 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar26 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar26 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar26 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar26 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar26 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar26 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar26 >> 0x77,0) & 1) << 0xe | (ushort)(auVar26[0xf] >> 7) << 0xf
        ;
        if (uVar19 != 0) break;
        aVar12.slot_ = (slot_type *)((long)local_1a0.slot_ + 0x10);
        local_1a8 = (anon_union_8_1_a8a14541_for_iterator_2 *)
                    ((long)local_1a8 + (long)((long)local_1a0.slot_ + 0x10) & (ulong)local_1b0.slot_
                    );
        local_1a0.slot_ = aVar12.slot_;
        if (local_188.capacity_ < aVar12.slot_) {
          __assert_fail("(seq.index() <= capacity() && \"full table!\") && \"Try enabling sanitizers.\""
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0xf7d,
                        "std::pair<iterator, bool> absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, google::protobuf::(anonymous namespace)::JsonNameDetails>, absl::container_internal::StringHash, absl::container_internal::StringEq, std::allocator<std::pair<const std::basic_string<char>, google::protobuf::(anonymous namespace)::JsonNameDetails>>>::find_or_prepare_insert_non_soo(const K &) [Policy = absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, google::protobuf::(anonymous namespace)::JsonNameDetails>, Hash = absl::container_internal::StringHash, Eq = absl::container_internal::StringEq, Alloc = std::allocator<std::pair<const std::basic_string<char>, google::protobuf::(anonymous namespace)::JsonNameDetails>>, K = std::basic_string<char>]"
                       );
        }
      }
      bVar5 = absl::lts_20250127::container_internal::ShouldInsertBackwardsForDebug
                        (local_188.capacity_,(size_t)common,local_188.heap_or_soo_.heap.control);
      if (bVar5) {
        uVar2 = 0xf;
        if (uVar19 != 0) {
          for (; uVar19 >> uVar2 == 0; uVar2 = uVar2 - 1) {
          }
        }
        uVar7 = (ushort)((uVar2 ^ 0xfff0) + 0x11) - 1;
      }
      else {
        uVar7 = absl::lts_20250127::container_internal::TrailingZeros<unsigned_short>(uVar19);
      }
      target.probe_length =
           (size_t)absl::lts_20250127::container_internal::
                   raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::(anonymous_namespace)::JsonNameDetails>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::(anonymous_namespace)::JsonNameDetails>>>
                   ::GetPolicyFunctions()::value;
      target.offset = (size_t)local_1a0.slot_;
      message = (DescriptorProto *)local_1a0;
      sVar17 = absl::lts_20250127::container_internal::PrepareInsertNonSoo
                         ((container_internal *)&local_188,common,
                          (long)local_1a8 + (ulong)uVar7 & (ulong)local_1b0.slot_,target,policy);
      bVar11 = 1;
      aVar12 = local_120;
LAB_00191aed:
      iVar43 = absl::lts_20250127::container_internal::
               raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>_>_>
               ::iterator_at((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>_>_>
                              *)&local_188,sVar17);
      this_00 = iVar43.field_1;
      local_c0 = iVar43;
      local_b0 = bVar11;
      if (bVar11 != 0) {
        sVar17 = local_188.capacity_;
        local_188.capacity_ = 0xffffffffffffff9c;
        local_78 = iVar43;
        std::__cxx11::string::string((string *)this_00.slot_,(string *)&local_160);
        *(anon_union_8_1_a8a14541_for_iterator_2 *)((long)this_00.slot_ + 0x20) = local_168;
        std::__cxx11::string::string((string *)((long)this_00.slot_ + 0x28),(string *)&local_160);
        *(string *)((long)this_00.slot_ + 0x48) = local_140;
        absl::lts_20250127::container_internal::CommonFields::set_capacity(&local_188,sVar17);
        ppVar10 = absl::lts_20250127::container_internal::
                  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>_>_>
                  ::iterator::operator*(&local_78);
        absl::lts_20250127::container_internal::
        raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>_>_>
        ::AssertNotDebugCapacity
                  ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>_>_>
                    *)&local_188);
        v_00._M_str = (ppVar10->first)._M_dataplus._M_p;
        v_00._M_len = (ppVar10->first)._M_string_length;
        sVar17 = absl::lts_20250127::container_internal::StringHash::operator()
                           ((StringHash *)&local_188,v_00);
        absl::lts_20250127::container_internal::probe
                  ((probe_seq<16UL> *)&local_1b0,&local_188,sVar17);
        local_f8._0_8_ = ppVar10;
        uVar18 = sVar17 & 0xffffffffffffff7f;
        auVar21 = ZEXT416((CONCAT11((char)sVar17,(char)sVar17) & 0xff7f) & 0xffff7fff);
        auVar21 = pshuflw(auVar21,auVar21,0);
        uVar20 = auVar21._0_4_;
        auVar24._4_4_ = uVar20;
        auVar24._0_4_ = uVar20;
        auVar24._8_4_ = uVar20;
        auVar24._12_4_ = uVar20;
        uVar14 = local_188.heap_or_soo_.heap.control;
        while( true ) {
          pcVar16 = (ctrl_t *)(uVar14 + (long)local_1a8);
          auVar23[0] = -(auVar24[0] == *pcVar16);
          auVar23[1] = -(auVar24[1] == pcVar16[1]);
          auVar23[2] = -(auVar24[2] == pcVar16[2]);
          auVar23[3] = -(auVar24[3] == pcVar16[3]);
          auVar23[4] = -(auVar24[4] == pcVar16[4]);
          auVar23[5] = -(auVar24[5] == pcVar16[5]);
          auVar23[6] = -(auVar24[6] == pcVar16[6]);
          auVar23[7] = -(auVar24[7] == pcVar16[7]);
          auVar23[8] = -(auVar24[8] == pcVar16[8]);
          auVar23[9] = -(auVar24[9] == pcVar16[9]);
          auVar23[10] = -(auVar24[10] == pcVar16[10]);
          auVar23[0xb] = -(auVar24[0xb] == pcVar16[0xb]);
          auVar23[0xc] = -(auVar24[0xc] == pcVar16[0xc]);
          auVar23[0xd] = -(auVar24[0xd] == pcVar16[0xd]);
          auVar23[0xe] = -(auVar24[0xe] == pcVar16[0xe]);
          auVar23[0xf] = -(auVar24[0xf] == pcVar16[0xf]);
          cVar25 = *pcVar16;
          cVar28 = pcVar16[1];
          cVar29 = pcVar16[2];
          cVar30 = pcVar16[3];
          cVar31 = pcVar16[4];
          cVar32 = pcVar16[5];
          cVar33 = pcVar16[6];
          cVar34 = pcVar16[7];
          cVar35 = pcVar16[8];
          cVar36 = pcVar16[9];
          cVar37 = pcVar16[10];
          cVar38 = pcVar16[0xb];
          cVar39 = pcVar16[0xc];
          cVar40 = pcVar16[0xd];
          cVar41 = pcVar16[0xe];
          cVar42 = pcVar16[0xf];
          for (uVar19 = (ushort)(SUB161(auVar23 >> 7,0) & 1) |
                        (ushort)(SUB161(auVar23 >> 0xf,0) & 1) << 1 |
                        (ushort)(SUB161(auVar23 >> 0x17,0) & 1) << 2 |
                        (ushort)(SUB161(auVar23 >> 0x1f,0) & 1) << 3 |
                        (ushort)(SUB161(auVar23 >> 0x27,0) & 1) << 4 |
                        (ushort)(SUB161(auVar23 >> 0x2f,0) & 1) << 5 |
                        (ushort)(SUB161(auVar23 >> 0x37,0) & 1) << 6 |
                        (ushort)(SUB161(auVar23 >> 0x3f,0) & 1) << 7 |
                        (ushort)(SUB161(auVar23 >> 0x47,0) & 1) << 8 |
                        (ushort)(SUB161(auVar23 >> 0x4f,0) & 1) << 9 |
                        (ushort)(SUB161(auVar23 >> 0x57,0) & 1) << 10 |
                        (ushort)(SUB161(auVar23 >> 0x5f,0) & 1) << 0xb |
                        (ushort)(SUB161(auVar23 >> 0x67,0) & 1) << 0xc |
                        (ushort)(SUB161(auVar23 >> 0x6f,0) & 1) << 0xd |
                        (ushort)(SUB161(auVar23 >> 0x77,0) & 1) << 0xe |
                        (ushort)(auVar23[0xf] >> 7) << 0xf; pcVar16 = iVar43.ctrl_, uVar19 != 0;
              uVar19 = uVar19 - 1 & uVar19) {
            local_108 = auVar24;
            local_d8 = (ctrl_t *)uVar14;
            local_48 = cVar25;
            cStack_47 = cVar28;
            cStack_46 = cVar29;
            cStack_45 = cVar30;
            cStack_44 = cVar31;
            cStack_43 = cVar32;
            cStack_42 = cVar33;
            cStack_41 = cVar34;
            cStack_40 = cVar35;
            cStack_3f = cVar36;
            cStack_3e = cVar37;
            cStack_3d = cVar38;
            cStack_3c = cVar39;
            cStack_3b = cVar40;
            cStack_3a = cVar41;
            cStack_39 = cVar42;
            uVar6 = absl::lts_20250127::container_internal::TrailingZeros<unsigned_short>(uVar19);
            local_118 = (anon_union_8_1_a8a14541_for_iterator_2)local_f8._0_8_;
            uVar18 = (ulong)uVar6;
            local_110.slot_ = (slot_type *)&local_188;
            bVar5 = absl::lts_20250127::container_internal::
                    hash_policy_traits<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::(anonymous_namespace)::JsonNameDetails>,void>
                    ::
                    apply<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::(anonymous_namespace)::JsonNameDetails>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::(anonymous_namespace)::JsonNameDetails>>>::EqualElement<std::__cxx11::string>,std::pair<std::__cxx11::string_const,google::protobuf::(anonymous_namespace)::JsonNameDetails>&,absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::(anonymous_namespace)::JsonNameDetails>>
                              ((EqualElement<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&local_118,
                               (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>
                                *)(((long)local_1a8 + uVar18 & (ulong)local_1b0.slot_) * 0x50 +
                                  (long)local_188.heap_or_soo_.heap.slot_array));
            if (bVar5) {
              iVar43 = absl::lts_20250127::container_internal::
                       raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>_>_>
                       ::iterator_at((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>_>_>
                                      *)&local_188,(long)local_1a8 + uVar18 & (ulong)local_1b0.slot_
                                    );
              goto LAB_00191d0c;
            }
            uVar14 = local_d8;
            auVar24 = local_108;
            cVar25 = local_48;
            cVar28 = cStack_47;
            cVar29 = cStack_46;
            cVar30 = cStack_45;
            cVar31 = cStack_44;
            cVar32 = cStack_43;
            cVar33 = cStack_42;
            cVar34 = cStack_41;
            cVar35 = cStack_40;
            cVar36 = cStack_3f;
            cVar37 = cStack_3e;
            cVar38 = cStack_3d;
            cVar39 = cStack_3c;
            cVar40 = cStack_3b;
            cVar41 = cStack_3a;
            cVar42 = cStack_39;
          }
          auVar27[0] = -(cVar25 == kEmpty);
          auVar27[1] = -(cVar28 == kEmpty);
          auVar27[2] = -(cVar29 == kEmpty);
          auVar27[3] = -(cVar30 == kEmpty);
          auVar27[4] = -(cVar31 == kEmpty);
          auVar27[5] = -(cVar32 == kEmpty);
          auVar27[6] = -(cVar33 == kEmpty);
          auVar27[7] = -(cVar34 == kEmpty);
          auVar27[8] = -(cVar35 == kEmpty);
          auVar27[9] = -(cVar36 == kEmpty);
          auVar27[10] = -(cVar37 == kEmpty);
          auVar27[0xb] = -(cVar38 == kEmpty);
          auVar27[0xc] = -(cVar39 == kEmpty);
          auVar27[0xd] = -(cVar40 == kEmpty);
          auVar27[0xe] = -(cVar41 == kEmpty);
          auVar27[0xf] = -(cVar42 == kEmpty);
          if ((((((((((((((((auVar27 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                           (auVar27 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar27 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar27 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar27 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar27 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar27 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar27 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar27 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar27 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar27 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar27 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar27 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar27 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar27 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              cVar42 == kEmpty) break;
          aVar12.slot_ = (slot_type *)((long)local_1a0.slot_ + 0x10);
          local_1a8 = (anon_union_8_1_a8a14541_for_iterator_2 *)
                      ((long)local_1a8 + (long)((long)local_1a0.slot_ + 0x10) &
                      (ulong)local_1b0.slot_);
          local_1a0.slot_ = aVar12.slot_;
          if (local_188.capacity_ < aVar12.slot_) {
            __assert_fail("(seq.index() <= capacity() && \"full table!\") && \"Try enabling sanitizers.\""
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                          ,0xe37,
                          "iterator absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, google::protobuf::(anonymous namespace)::JsonNameDetails>, absl::container_internal::StringHash, absl::container_internal::StringEq, std::allocator<std::pair<const std::basic_string<char>, google::protobuf::(anonymous namespace)::JsonNameDetails>>>::find_non_soo(const key_arg<K> &, size_t) [Policy = absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, google::protobuf::(anonymous namespace)::JsonNameDetails>, Hash = absl::container_internal::StringHash, Eq = absl::container_internal::StringEq, Alloc = std::allocator<std::pair<const std::basic_string<char>, google::protobuf::(anonymous namespace)::JsonNameDetails>>, K = std::basic_string<char>]"
                         );
          }
        }
        absl::lts_20250127::container_internal::
        raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>_>_>
        ::AssertNotDebugCapacity
                  ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>_>_>
                    *)&local_188);
        auVar3._8_8_ = 0;
        auVar3._0_8_ = uVar18;
        iVar43 = (iterator)(auVar3 << 0x40);
LAB_00191d0c:
        ctrl = iVar43.ctrl_;
        absl::lts_20250127::container_internal::AssertIsValidForComparison
                  (ctrl,'\0',(GenerationType *)0x0);
        absl::lts_20250127::container_internal::AssertIsValidForComparison
                  (pcVar16,'\0',(GenerationType *)0x0);
        policy = (PolicyFunctions *)0x0;
        message = (DescriptorProto *)&local_118;
        local_1b0 = iVar43.field_1;
        local_118 = this_00;
        absl::lts_20250127::container_internal::AssertSameContainer
                  (ctrl,pcVar16,&local_1b0.slot_,(void **)&local_118,(GenerationType *)0x0,
                   (GenerationType *)0x0);
        aVar12 = local_120;
        if (ctrl != pcVar16) {
          __assert_fail("PolicyTraits::apply(FindElement{*this}, *iter) == iter && \"constructed value does not match the lookup key\""
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0xfe2,
                        "void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, google::protobuf::(anonymous namespace)::JsonNameDetails>, absl::container_internal::StringHash, absl::container_internal::StringEq, std::allocator<std::pair<const std::basic_string<char>, google::protobuf::(anonymous namespace)::JsonNameDetails>>>::emplace_at(iterator, Args &&...) [Policy = absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, google::protobuf::(anonymous namespace)::JsonNameDetails>, Hash = absl::container_internal::StringHash, Eq = absl::container_internal::StringEq, Alloc = std::allocator<std::pair<const std::basic_string<char>, google::protobuf::(anonymous namespace)::JsonNameDetails>>, Args = <const std::piecewise_construct_t &, std::tuple<const std::basic_string<char> &>, std::tuple<google::protobuf::(anonymous namespace)::JsonNameDetails &>>]"
                       );
        }
      }
      ppvVar8 = local_c8;
      if ((local_b0 & 1) == 0) {
        pcVar13 = "operator->";
        absl::lts_20250127::container_internal::AssertIsFull
                  (local_c0.ctrl_,'\0',(GenerationType *)0x0,"operator->");
        ppVar10 = absl::lts_20250127::container_internal::
                  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>_>_>
                  ::iterator::operator*(&local_c0);
        message._1_7_ = (undefined7)((ulong)pcVar13 >> 8);
        message._0_1_ = local_140;
        if (((bVar4 ^ 1 | (byte)local_140) & 1) == 0) {
          if ((ppVar10->second).is_custom == false) goto LAB_00191e94;
          bVar11 = 0;
        }
        else {
          bVar11 = (byte)local_140 | (byte)local_18c;
        }
        local_1a8 = (anon_union_8_1_a8a14541_for_iterator_2 *)&ppVar10->second;
        local_1b0.slot_ = (slot_type *)&local_168;
        local_1a0 = aVar12;
        if (((local_e0->merged_features_->field_0)._impl_.json_format_ == 2) &&
           ((bVar11 & (ppVar10->second).is_custom & 1) == 0)) {
          pcStack_90 = absl::lts_20250127::functional_internal::
                       InvokeObject<google::protobuf::DescriptorBuilder::CheckFieldJsonNameUniqueness(std::basic_string_view<char,std::char_traits<char>>,google::protobuf::DescriptorProto_const&,google::protobuf::Descriptor_const*,bool)::__1,std::__cxx11::string>
          ;
          local_98.obj = &local_1b0;
          element_name_00._M_str = local_128;
          element_name_00._M_len = local_130;
          make_error_01.invoker_ =
               absl::lts_20250127::functional_internal::
               InvokeObject<google::protobuf::DescriptorBuilder::CheckFieldJsonNameUniqueness(std::basic_string_view<char,std::char_traits<char>>,google::protobuf::DescriptorProto_const&,google::protobuf::Descriptor_const*,bool)::__1,std::__cxx11::string>
          ;
          make_error_01.ptr_.obj = local_98.obj;
          AddWarning(local_138,element_name_00,(Message *)aVar12.slot_,NAME,make_error_01);
          message = (DescriptorProto *)aVar12;
        }
        else {
          pcStack_a0 = absl::lts_20250127::functional_internal::
                       InvokeObject<google::protobuf::DescriptorBuilder::CheckFieldJsonNameUniqueness(std::basic_string_view<char,std::char_traits<char>>,google::protobuf::DescriptorProto_const&,google::protobuf::Descriptor_const*,bool)::__1,std::__cxx11::string>
          ;
          local_a8.obj = &local_1b0;
          element_name_01._M_str = local_128;
          element_name_01._M_len = local_130;
          make_error_02.invoker_ =
               absl::lts_20250127::functional_internal::
               InvokeObject<google::protobuf::DescriptorBuilder::CheckFieldJsonNameUniqueness(std::basic_string_view<char,std::char_traits<char>>,google::protobuf::DescriptorProto_const&,google::protobuf::Descriptor_const*,bool)::__1,std::__cxx11::string>
          ;
          make_error_02.ptr_.obj = local_a8.obj;
          AddError(local_138,element_name_01,(Message *)aVar12.slot_,NAME,make_error_02);
          message = (DescriptorProto *)aVar12;
        }
      }
    }
LAB_00191e94:
    std::__cxx11::string::~string((string *)&local_160);
    ppvVar8 = ppvVar8 + 1;
  } while( true );
}

Assistant:

void DescriptorBuilder::CheckFieldJsonNameUniqueness(
    const absl::string_view message_name, const DescriptorProto& message,
    const Descriptor* descriptor, bool use_custom_names) {
  absl::flat_hash_map<std::string, JsonNameDetails> name_to_field;
  for (const FieldDescriptorProto& field : message.field()) {
    JsonNameDetails details = GetJsonNameDetails(&field, use_custom_names);
    if (details.is_custom && JsonNameLooksLikeExtension(details.orig_name)) {
      auto make_error = [&] {
        return absl::StrFormat(
            "The custom JSON name of field \"%s\" (\"%s\") is invalid: "
            "JSON names may not start with '[' and end with ']'.",
            field.name(), details.orig_name);
      };
      AddError(message_name, field, DescriptorPool::ErrorCollector::NAME,
               make_error);
      continue;
    }
    auto it_inserted = name_to_field.try_emplace(details.orig_name, details);
    if (it_inserted.second) {
      continue;
    }
    JsonNameDetails& match = it_inserted.first->second;
    if (use_custom_names && !details.is_custom && !match.is_custom) {
      // if this pass is considering custom JSON names, but neither of the
      // names involved in the conflict are custom, don't bother with a
      // message. That will have been reported from other pass (non-custom
      // JSON names).
      continue;
    }
    auto make_error = [&] {
      absl::string_view this_type = details.is_custom ? "custom" : "default";
      absl::string_view existing_type = match.is_custom ? "custom" : "default";
      // If the matched name differs (which it can only differ in case), include
      // it in the error message, for maximum clarity to user.
      std::string name_suffix = "";
      if (details.orig_name != match.orig_name) {
        name_suffix = absl::StrCat(" (\"", match.orig_name, "\")");
      }
      return absl::StrFormat(
          "The %s JSON name of field \"%s\" (\"%s\") conflicts "
          "with the %s JSON name of field \"%s\"%s.",
          this_type, field.name(), details.orig_name, existing_type,
          match.field->name(), name_suffix);
    };

    bool involves_default = !details.is_custom || !match.is_custom;
    if (descriptor->features().json_format() ==
            FeatureSet::LEGACY_BEST_EFFORT &&
        involves_default) {
      // TODO Upgrade this to an error once downstream protos
      // have been fixed.
      AddWarning(message_name, field, DescriptorPool::ErrorCollector::NAME,
                 make_error);
    } else {
      AddError(message_name, field, DescriptorPool::ErrorCollector::NAME,
               make_error);
    }
  }
}